

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Digit.hpp
# Opt level: O0

void Qentem::Digit::formatStringNumberFixed<false,Qentem::StringStream<char>>
               (StringStream<char> *stream,SizeT started_at,SizeT32 precision,
               SizeT32 calculated_digits,SizeT32 fraction_length,bool round_up)

{
  SizeT32 SVar1;
  SizeT32 SVar2;
  SizeT SVar3;
  char *pcVar4;
  bool bVar5;
  uint local_68;
  SizeT needed;
  SizeT rem;
  SizeT zeros;
  Char_T *last;
  Char_T *number;
  SizeT32 local_40;
  bool fraction_only;
  uint uStack_3c;
  bool power_increased;
  SizeT32 diff;
  SizeT dot_index;
  SizeT index;
  SizeT number_length;
  Char_T *storage;
  SizeT32 local_20;
  SizeT32 SStack_1c;
  bool round_up_local;
  SizeT32 fraction_length_local;
  SizeT32 calculated_digits_local;
  SizeT32 precision_local;
  SizeT started_at_local;
  StringStream<char> *stream_local;
  
  storage._7_1_ = round_up;
  local_20 = fraction_length;
  SStack_1c = calculated_digits;
  fraction_length_local = precision;
  calculated_digits_local = started_at;
  _precision_local = stream;
  _index = StringStream<char>::Storage(stream);
  SVar3 = StringStream<char>::Length(_precision_local);
  dot_index = SVar3 - calculated_digits_local;
  diff = calculated_digits_local;
  uStack_3c = calculated_digits_local + local_20;
  if (dot_index < local_20) {
    local_68 = local_20 - dot_index;
  }
  else {
    local_68 = 0;
  }
  local_40 = local_68;
  number._7_1_ = 0;
  number._6_1_ = dot_index <= local_20;
  if (local_20 != 0) {
    if (fraction_length_local < local_68) {
      diff = (dot_index - 1) + calculated_digits_local;
      _index[diff] = '0';
    }
    else {
      if (fraction_length_local < local_20) {
        diff = (local_20 - (fraction_length_local + 1)) + calculated_digits_local;
        roundStringNumber<Qentem::StringStream<char>>
                  (_precision_local,&diff,(bool *)((long)&number + 7),
                   (storage._7_1_ & 1) != 0 || local_68 != 0);
        last = _index + diff;
        pcVar4 = StringStream<char>::Last(_precision_local);
        while( true ) {
          bVar5 = false;
          if (last < pcVar4) {
            bVar5 = *last == '0';
          }
          if (!bVar5) break;
          last = last + 1;
          diff = diff + 1;
        }
      }
      SVar1 = diff;
      if ((number._6_1_ & 1) == 0) {
        if (diff < uStack_3c) {
          StringStream<char>::InsertAt(_precision_local,'.',uStack_3c);
        }
        else {
          needed = 0;
          if ((number._7_1_ & 1) == 0) {
            if (dot_index - SStack_1c < diff - calculated_digits_local) {
              needed = (diff - calculated_digits_local) - (dot_index - SStack_1c);
            }
          }
          else {
            needed = dot_index - local_20;
          }
          for (; needed != 0; needed = needed - 1) {
            diff = diff - 1;
            _index[diff] = '0';
          }
        }
      }
      else {
        SVar3 = StringStream<char>::Length(_precision_local);
        SVar2 = diff;
        if ((SVar1 < SVar3) || ((number._7_1_ & 1) != 0)) {
          if (local_40 == 0) {
            if ((number._7_1_ & 1) == 0) {
              StringStream<char>::operator+=(_precision_local,'.');
              StringStream<char>::operator+=(_precision_local,'0');
            }
          }
          else {
            if ((number._7_1_ & 1) != 0) {
              SVar3 = StringStream<char>::Length(_precision_local);
              diff = diff - (SVar2 == SVar3);
              _index[diff] = '1';
            }
            local_40 = local_40 - (number._7_1_ & 1);
            insertZerosLarge<Qentem::StringStream<char>>(_precision_local,local_40);
            StringStream<char>::operator+=(_precision_local,'.');
            StringStream<char>::operator+=(_precision_local,'0');
          }
        }
        else {
          diff = diff - 1;
          _index[diff] = '0';
        }
      }
    }
  }
  StringStream<char>::Reverse(_precision_local,calculated_digits_local);
  StringStream<char>::StepBack(_precision_local,diff - calculated_digits_local);
  return;
}

Assistant:

static void formatStringNumberFixed(Stream_T &stream, const SizeT started_at, const SizeT32 precision,
                                        const SizeT32 calculated_digits, const SizeT32 fraction_length,
                                        const bool round_up) {
        using Char_T              = typename Stream_T::CharType;
        Char_T     *storage       = stream.Storage();
        const SizeT number_length = (stream.Length() - started_at);
        SizeT       index         = started_at;
        const SizeT dot_index     = SizeT(started_at + fraction_length);
        SizeT32     diff          = ((fraction_length > number_length) ? SizeT32(fraction_length - number_length) : 0);
        bool        power_increased = false;
        const bool  fraction_only   = (number_length <= fraction_length);
        /////////////////////////////////////////////////////
        if (fraction_length != 0) {
            if (diff <= precision) {
                if (fraction_length > precision) {
                    index += SizeT(fraction_length - (precision + SizeT{1}));
                    roundStringNumber(stream, index, power_increased, (round_up | (diff != 0)));

                    Char_T       *number = (storage + index);
                    const Char_T *last   = stream.Last();

                    while ((number < last) && (*number == DigitUtils::DigitChar::Zero)) {
                        ++number;
                        ++index;
                    }
                }

                if (fraction_only) {
                    if ((index < stream.Length()) || power_increased) {
                        if (diff != 0) {
                            if (power_increased) {
                                index -= SizeT(index == stream.Length());
                                storage[index] = DigitUtils::DigitChar::One;
                            }

                            diff -= SizeT32(power_increased);
                            insertZerosLarge(stream, diff);
                            stream += DigitUtils::DigitChar::Dot;
                            stream += DigitUtils::DigitChar::Zero;
                        } else if (!power_increased) {
                            stream += DigitUtils::DigitChar::Dot;
                            stream += DigitUtils::DigitChar::Zero;
                        }
                    } else {
                        --index;
                        storage[index] = DigitUtils::DigitChar::Zero;
                    }
                } else if (index < dot_index) {
                    stream.InsertAt(DigitUtils::DigitChar::Dot, dot_index);
                } else {
                    SizeT zeros = 0;

                    if (power_increased) {
                        zeros = SizeT(number_length - fraction_length);
                    } else {
                        const SizeT rem    = (index - started_at);
                        const SizeT needed = SizeT(number_length - calculated_digits);

                        if (rem > needed) {
                            zeros = (rem - needed);
                        }
                    }

                    while (zeros != 0) {
                        --index;
                        storage[index] = DigitUtils::DigitChar::Zero;
                        --zeros;
                    }
                }
            } else {
                index += (number_length - SizeT{1});
                storage[index] = DigitUtils::DigitChar::Zero;
            }
        }

        stream.Reverse(started_at);
        stream.StepBack(index - started_at);

        if QENTEM_CONST_EXPRESSION (Fixed_T) {
            if ((dot_index == index) || ((stream.Length() - started_at) == SizeT{1}) ||
                (!fraction_only && power_increased)) {
                stream += DigitUtils::DigitChar::Dot;
                insertZerosLarge(stream, precision);
            } else if (fraction_only) {
                insertZerosLarge(
                    stream, SizeT32(precision -
                                    SizeT32(stream.Length() - (started_at + SizeT{2})))); // 2 is the length of '0.'.
            } else {
                insertZerosLarge(stream, SizeT32(precision - (dot_index - index)));
            }
        }
    }